

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this;
  size_type in_RCX;
  pointer __old_p;
  Player *pPVar4;
  int iVar5;
  long lVar6;
  Player *pPVar7;
  long lVar8;
  allocator<char> local_f9;
  Player *local_f8;
  _Head_base<0UL,_Player_*,_false> local_f0;
  _Head_base<0UL,_Player_*,_false> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  undefined1 local_c8 [16];
  Game game;
  string turns;
  
  turns._M_dataplus._M_p = (pointer)&turns.field_2;
  turns._M_string_length = 0;
  turns.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&arguments,(long)(argc + -1),(allocator_type *)&game);
  lVar6 = 0;
  for (lVar8 = 1; lVar8 < argc; lVar8 = lVar8 + 1) {
    std::__cxx11::string::assign
              ((char *)((long)&((arguments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6));
    lVar6 = lVar6 + 0x20;
  }
  pPVar4 = (Player *)0x0;
  pPVar7 = (Player *)0x0;
  local_c8._8_8_ = 0;
  iVar5 = 0;
  do {
    if (argc + -1 <= iVar5) {
      if (pPVar4 == (Player *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&game,"local",&local_f9);
        create_player((string *)local_c8);
        pPVar4 = (Player *)local_c8._0_8_;
        std::__cxx11::string::~string((string *)&game);
      }
      local_f0._M_head_impl = pPVar7;
      if (pPVar7 == (Player *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&game,"local",&local_f9);
        create_player((string *)local_c8);
        std::__cxx11::string::~string((string *)&game);
        local_f0._M_head_impl = (Player *)local_c8._0_8_;
      }
      local_e8._M_head_impl = pPVar4;
      Game::Game(&game,(unique_ptr<Player,_std::default_delete<Player>_> *)&local_e8,
                 (unique_ptr<Player,_std::default_delete<Player>_> *)&local_f0,
                 (bool)(local_c8[8] & 1),&turns);
      if (local_f0._M_head_impl != (Player *)0x0) {
        (*(local_f0._M_head_impl)->_vptr_Player[1])();
      }
      local_f0._M_head_impl = (Player *)0x0;
      if (local_e8._M_head_impl != (Player *)0x0) {
        (*(local_e8._M_head_impl)->_vptr_Player[1])();
      }
      local_e8._M_head_impl = (Player *)0x0;
      Game::play_game(&game);
      Game::~Game(&game);
      pPVar4 = (Player *)0x0;
      pPVar7 = (Player *)0x0;
LAB_00105150:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arguments);
      if (pPVar7 != (Player *)0x0) {
        (*pPVar7->_vptr_Player[1])(pPVar7);
      }
      if (pPVar4 != (Player *)0x0) {
        (*pPVar4->_vptr_Player[1])(pPVar4);
      }
      std::__cxx11::string::~string((string *)&turns);
      return 0;
    }
    bVar2 = std::operator==(arguments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar5,"--white");
    if (bVar2) {
      create_player((string *)&game);
      uVar1 = game._0_8_;
      game.m_walk_through = false;
      game._1_7_ = 0;
      if ((pPVar4 != (Player *)0x0) && ((*pPVar4->_vptr_Player[1])(pPVar4), game._0_8_ != 0)) {
        (**(code **)(*(long *)game._0_8_ + 8))();
      }
      iVar5 = iVar5 + 1;
      pPVar4 = (Player *)uVar1;
    }
    else {
      bVar2 = std::operator==(arguments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar5,"--black");
      if (bVar2) {
        local_f8 = pPVar7;
        create_player((string *)&game);
        pPVar7 = (Player *)game._0_8_;
        game.m_walk_through = false;
        game._1_7_ = 0;
        if ((local_f8 != (Player *)0x0) && ((*local_f8->_vptr_Player[1])(), game._0_8_ != 0)) {
          (**(code **)(*(long *)game._0_8_ + 8))();
        }
      }
      else {
        bVar2 = std::operator==(arguments.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar5,"--turns");
        if (!bVar2) {
          bVar2 = std::operator==(arguments.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + iVar5,"--walk-through"
                                 );
          in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
          local_c8._8_8_ = in_RCX;
          if (bVar2) goto LAB_00105064;
          bVar2 = std::operator==(arguments.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + iVar5,"-h");
          if ((!bVar2) &&
             (bVar2 = std::operator==(arguments.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + iVar5,"--help"),
             !bVar2)) {
            local_f8 = pPVar7;
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &game,"Unknown argument ",
                           arguments.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar5);
            std::runtime_error::runtime_error(this,(string *)&game);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                                  );
          poVar3 = std::operator<<(poVar3," [--turns [e2e4 ...]] [--walk-through]");
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00105150;
        }
        std::__cxx11::string::_M_assign((string *)&turns);
      }
      iVar5 = iVar5 + 1;
    }
LAB_00105064:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    // Set default game settings.
    bool walk_through = false;
    string turns;
    unique_ptr<Player> white;
    unique_ptr<Player> black;

    // Parse arguments.
    vector<string> arguments(argc - 1);
    for (int i = 1; i < argc; i++) {
        arguments[i - 1] = argv[i];
    }
    for (int index = 0; index < argc - 1; index++) {
        if (arguments[index] == "--white") {
            // White player definition.
            white = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--black") {
            // Black player definition.
            black = create_player(arguments[index + 1]);
            index++;
        } else if (arguments[index] == "--turns") {
            // Pre turns definition.
            turns = arguments[index + 1];
            index++;
        } else if (arguments[index] == "--walk-through") {
            // Walk through pre turns.
            walk_through = true;
        } else if ((arguments[index] == "-h") || (arguments[index] == "--help")) {
            // Display help.
            cout << "Usage: chess [--white (local|client|server)[:IP:PORT]] [--black (local|client|server)[:IP:PORT]]"
                 << " [--turns [e2e4 ...]] [--walk-through]" << endl;
            return 0;
        } else {
            // Unknown argument.
            throw runtime_error("Unknown argument " + arguments[index]);
        }
    }

    // Fallback default players if not specified.
    if (white == nullptr) {
        white = create_player("local");
    }
    if (black == nullptr) {
        black = create_player("local");
    }

    // Initialize the game.
    Game game(move(white), move(black), walk_through, turns);

    // Play.
    game.play_game();

    return 0;
}